

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

double __thiscall
despot::Parser::InitialWeight(Parser *this,vector<int,_std::allocator<int>_> *state)

{
  pointer pTVar1;
  int s;
  ulong uVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  
  dVar4 = 1.0;
  lVar3 = 0;
  for (uVar2 = 0;
      uVar2 < (ulong)(((long)(this->curr_state_vars_).
                             super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->curr_state_vars_).
                            super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>.
                            _M_impl.super__Vector_impl_data._M_start) / 0xc0); uVar2 = uVar2 + 1) {
    pTVar1 = (this->initial_belief_funcs_).
             super__Vector_base<despot::TabularCPT,_std::allocator<despot::TabularCPT>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar5 = (double)(**(code **)(*(long *)((long)&(pTVar1->super_CPT).super_Function._vptr_Function
                                          + lVar3) + 0x20))
                              ((long)&(pTVar1->super_CPT).super_Function._vptr_Function + lVar3,0,
                               (state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start[uVar2]);
    dVar4 = dVar4 * dVar5;
    lVar3 = lVar3 + 0x70;
  }
  return dVar4;
}

Assistant:

double Parser::InitialWeight(const vector<int>& state) const {
	double prob = 1;
	for (int s = 0; s < curr_state_vars_.size(); s++) {
		prob *= initial_belief_funcs_[s].GetValue(0, state[s]);
	}
	return prob;
}